

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_resampler.cc
# Opt level: O0

void __thiscall webrtc::PushResampler<float>::~PushResampler(PushResampler<float> *this)

{
  PushResampler<float> *this_local;
  
  this->_vptr_PushResampler = (_func_int **)&PTR__PushResampler_002fb7d0;
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&this->dst_right_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&this->dst_left_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&this->src_right_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&this->src_left_);
  std::unique_ptr<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>::
  ~unique_ptr(&this->sinc_resampler_right_);
  std::unique_ptr<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>::
  ~unique_ptr(&this->sinc_resampler_);
  return;
}

Assistant:

PushResampler<T>::~PushResampler() {
}